

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode.h
# Opt level: O0

rgba_t sfc::reduce_color(rgba_t color,Mode to_mode)

{
  code *pcVar1;
  byte bVar2;
  rgba_t rVar3;
  rgba_color local_48;
  rgba_t scaled_5;
  rgba_color c_5;
  rgba_t scaled_4;
  rgba_color c_4;
  rgba_t scaled_3;
  rgba_color c_3;
  rgba_t scaled_2;
  channel_t gray_1;
  rgba_color c_2;
  rgba_t scaled_1;
  channel_t gray;
  rgba_color c_1;
  rgba_t scaled;
  rgba_color c;
  Mode to_mode_local;
  rgba_t color_local;
  
  switch(to_mode) {
  case none:
    to_mode_local = none;
    break;
  case snes:
  case snes_mode7:
  case gbc:
  case gba:
  case gba_affine:
    if (color >> 0x18 < 0x80) {
      to_mode_local = none;
    }
    else {
      rgba_color::rgba_color(&c_1,color);
      c_1.r = (channel_t)((int)(uint)c_1.r >> 3);
      c_1.g = (channel_t)((int)(uint)c_1.g >> 3);
      c_1.b = (channel_t)((int)(uint)c_1.b >> 3);
      rVar3 = rgba_color::operator_cast_to_unsigned_int(&c_1);
      to_mode_local = (rVar3 & 0xffffff) - 0x1000000;
    }
    break;
  case gb:
    rgba_color::rgba_color((rgba_color *)&scaled_1,color);
    bVar2 = (byte)(int)((double)scaled_1._2_1_ * 0.114 +
                       (double)(byte)scaled_1 * 0.299 + (double)scaled_1._1_1_ * 0.587);
    if (bVar2 < 0x41) {
      c_2.a = '\0';
    }
    else if (bVar2 < 0x81) {
      c_2.a = '\x01';
    }
    else if (bVar2 < 0xc1) {
      c_2.a = '\x02';
    }
    else {
      c_2.a = '\x03';
    }
    scaled_1._2_1_ = c_2.a;
    scaled_1._1_1_ = c_2.a;
    scaled_1._0_1_ = c_2.a;
    rVar3 = rgba_color::operator_cast_to_unsigned_int((rgba_color *)&scaled_1);
    to_mode_local = (rVar3 & 0xffffff) - 0x1000000;
    break;
  case md:
  case pce:
  case pce_sprite:
    if (color >> 0x18 < 0x80) {
      to_mode_local = none;
    }
    else {
      rgba_color::rgba_color(&c_4,color);
      c_4.r = (channel_t)((int)(uint)c_4.r >> 5);
      c_4.g = (channel_t)((int)(uint)c_4.g >> 5);
      c_4.b = (channel_t)((int)(uint)c_4.b >> 5);
      rVar3 = rgba_color::operator_cast_to_unsigned_int(&c_4);
      to_mode_local = (rVar3 & 0xffffff) - 0x1000000;
    }
    break;
  case ws:
  case ngp:
    rgba_color::rgba_color((rgba_color *)&scaled_2,color);
    scaled_2._0_1_ =
         (byte)((int)((int)((double)scaled_2._2_1_ * 0.114 +
                           (double)(byte)scaled_2 * 0.299 + (double)scaled_2._1_1_ * 0.587) & 0xffU)
               >> 5);
    scaled_2._1_1_ = (byte)scaled_2;
    scaled_2._2_1_ = (byte)scaled_2;
    rVar3 = rgba_color::operator_cast_to_unsigned_int((rgba_color *)&scaled_2);
    to_mode_local = (rVar3 & 0xffffff) - 0x1000000;
    break;
  case wsc:
  case wsc_packed:
  case ngpc:
  case gg:
    if (color >> 0x18 < 0x80) {
      to_mode_local = none;
    }
    else {
      rgba_color::rgba_color(&local_48,color);
      local_48.r = (channel_t)((int)(uint)local_48.r >> 4);
      local_48.g = (channel_t)((int)(uint)local_48.g >> 4);
      local_48.b = (channel_t)((int)(uint)local_48.b >> 4);
      rVar3 = rgba_color::operator_cast_to_unsigned_int(&local_48);
      to_mode_local = (rVar3 & 0xffffff) - 0x1000000;
    }
    break;
  case sms:
    rgba_color::rgba_color(&c_5,color);
    c_5.r = (channel_t)((int)(uint)c_5.r >> 6);
    c_5.g = (channel_t)((int)(uint)c_5.g >> 6);
    c_5.b = (channel_t)((int)(uint)c_5.b >> 6);
    rVar3 = rgba_color::operator_cast_to_unsigned_int(&c_5);
    to_mode_local = (rVar3 & 0xffffff) - 0x1000000;
    break;
  default:
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  return to_mode_local;
}

Assistant:

inline rgba_t reduce_color(const rgba_t color, Mode to_mode) {
  switch (to_mode) {
  case Mode::snes:
  case Mode::snes_mode7:
  case Mode::gbc:
  case Mode::gba:
  case Mode::gba_affine:
    if (((color & 0xff000000) >> 24) < 0x80) {
      return transparent_color;
    } else {
      rgba_color c(color);
      c.r >>= 3;
      c.g >>= 3;
      c.b >>= 3;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::gb:
    {
      rgba_color c(color);
      channel_t gray = c.r * 0.299 + c.g * 0.587 + c.b * 0.114;
      if (gray <= 0x40) gray = 0;
      else if (gray <= 0x80) gray = 1;
      else if (gray <= 0xc0) gray = 2;
      else gray = 3;
      c.r = c.g = c.b = gray;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::ws:
  case Mode::ngp:
    {
      // TODO: WonderSwan technically supports 8 out of 16 gray shades.
      // Currently, we do not support this additional distinction.
      // Note that Neo Geo Pocket only supports 8 shades.
      rgba_color c(color);
      channel_t gray = c.r * 0.299 + c.g * 0.587 + c.b * 0.114;
      c.r = c.g = c.b = gray >> 5;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::md:
  case Mode::pce:
  case Mode::pce_sprite:
    if (((color & 0xff000000) >> 24) < 0x80) {
      return transparent_color;
    } else {
      rgba_color c(color);
      c.r >>= 5;
      c.g >>= 5;
      c.b >>= 5;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::sms: {
    rgba_color c(color);
    c.r >>= 6;
    c.g >>= 6;
    c.b >>= 6;
    rgba_t scaled = c;
    return (scaled & 0x00ffffff) + 0xff000000;
  }
    break;
  case Mode::wsc:
  case Mode::wsc_packed:
  case Mode::ngpc:
  case Mode::gg:
    if (((color & 0xff000000) >> 24) < 0x80) {
      return transparent_color;
    } else {
      rgba_color c(color);
      c.r >>= 4;
      c.g >>= 4;
      c.b >>= 4;
      rgba_t scaled = c;
      return (scaled & 0x00ffffff) + 0xff000000;
    }
    break;
  case Mode::none:
    return 0;
  }
}